

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_namedEntityNotEqualNonNamedEntity_Test::TestBody
          (Equality_namedEntityNotEqualNonNamedEntity_Test *this)

{
  byte bVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  VariablePtr v1;
  ResetPtr r1;
  ImportSourcePtr is1;
  long *local_80;
  AssertHelper local_78 [8];
  byte local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult local_60;
  long local_50 [2];
  shared_ptr *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  shared_ptr *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  shared_ptr *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_60._0_8_ = (shared_ptr *)local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"variableA","");
  libcellml::Variable::create((string *)&local_40);
  if ((shared_ptr *)local_60._0_8_ != (shared_ptr *)local_50) {
    operator_delete((void *)local_60._0_8_,local_50[0] + 1);
  }
  libcellml::ImportSource::create();
  libcellml::Reset::create();
  local_60._0_8_ = local_20;
  local_60.message_.ptr_ = local_18;
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_18->_M_string_length = (int)local_18->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_18->_M_string_length = (int)local_18->_M_string_length + 1;
    }
  }
  bVar1 = libcellml::Entity::equals(local_40);
  local_70[0] = bVar1 ^ 1;
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar1 != 0) goto LAB_0012338b;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.message_.ptr_);
    if ((local_70[0] & 1) == 0) {
LAB_0012338b:
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,(char *)local_70,"v1->equals(is1)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x3ed,(char *)local_60._0_8_);
      testing::internal::AssertHelper::operator=(local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(local_78);
      if ((shared_ptr *)local_60._0_8_ != (shared_ptr *)local_50) {
        operator_delete((void *)local_60._0_8_,local_50[0] + 1);
      }
      if (((local_80 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60._0_8_ = local_40;
  local_60.message_.ptr_ = local_38;
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
    }
  }
  bVar1 = libcellml::Entity::equals(local_20);
  local_70[0] = bVar1 ^ 1;
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar1 != 0) goto LAB_001234ad;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.message_.ptr_);
    if ((local_70[0] & 1) == 0) {
LAB_001234ad:
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,(char *)local_70,"is1->equals(v1)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x3ee,(char *)local_60._0_8_);
      testing::internal::AssertHelper::operator=(local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(local_78);
      if ((shared_ptr *)local_60._0_8_ != (shared_ptr *)local_50) {
        operator_delete((void *)local_60._0_8_,local_50[0] + 1);
      }
      if (((local_80 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60._0_8_ = local_30;
  local_60.message_.ptr_ = local_28;
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
    }
  }
  bVar1 = libcellml::Entity::equals(local_40);
  local_70[0] = bVar1 ^ 1;
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar1 != 0) goto LAB_001235cf;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.message_.ptr_);
    if ((local_70[0] & 1) == 0) {
LAB_001235cf:
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,(char *)local_70,"v1->equals(r1)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x3f0,(char *)local_60._0_8_);
      testing::internal::AssertHelper::operator=(local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(local_78);
      if ((shared_ptr *)local_60._0_8_ != (shared_ptr *)local_50) {
        operator_delete((void *)local_60._0_8_,local_50[0] + 1);
      }
      if (((local_80 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60._0_8_ = local_40;
  local_60.message_.ptr_ = local_38;
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
    }
  }
  bVar1 = libcellml::Entity::equals(local_30);
  local_70[0] = bVar1 ^ 1;
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar1 == 0) goto LAB_00123795;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.message_.ptr_);
    if ((local_70[0] & 1) != 0) goto LAB_00123795;
  }
  testing::Message::Message((Message *)&local_80);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_60,(char *)local_70,"r1->equals(v1)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x3f1,(char *)local_60._0_8_);
  testing::internal::AssertHelper::operator=(local_78,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(local_78);
  if ((shared_ptr *)local_60._0_8_ != (shared_ptr *)local_50) {
    operator_delete((void *)local_60._0_8_,local_50[0] + 1);
  }
  if (((local_80 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_80 != (long *)0x0)) {
    (**(code **)(*local_80 + 8))();
  }
LAB_00123795:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}